

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_ru_u_access<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,false,true>>>
               (void)

{
  uint uVar1;
  _Hash_node_base *p_Var2;
  _Hash_node_base *p_Var3;
  _Hash_node_base *p_Var4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  pointer pvVar13;
  pool<boost::default_user_allocator_malloc_free> *ppVar14;
  node_ptr next;
  _Base_ptr p_Var15;
  _Hash_node_base *p_Var16;
  ulong uVar17;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  uColumns;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  orderedBoundaries;
  Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_true>_>
  m;
  shared_count sStack_390;
  char *local_388;
  _Base_ptr local_380;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_378;
  _Hash_node_base *local_358;
  undefined1 local_350;
  _Base_ptr local_348;
  _Base_ptr local_340;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_328;
  char *local_310;
  char *local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  pool<boost::default_user_allocator_malloc_free> *local_1f0;
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_true>_>_>
  local_1e8;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,false,true>>>>
            ();
  local_1f0 = (pool<boost::default_user_allocator_malloc_free> *)operator_new(0x38);
  (((Entry_constructor *)&local_1f0->super_simple_segregated_storage<unsigned_long>)->entryPool_).
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  (local_1f0->list).ptr = (char *)0x0;
  (local_1f0->list).sz = 0;
  local_1f0->requested_size = 0x30;
  local_1f0->next_size = 0x20;
  local_1f0->start_size = 0x20;
  local_1f0->max_size = 0;
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,false,true>>>
  ::RU_matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,false,true>>>
              *)&local_1e8,&local_328,(Column_settings *)local_1f0);
  local_378.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_378.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_378.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var15 = (_Base_ptr)operator_new(0xa8);
  local_378.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)p_Var15;
  local_378.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&p_Var15[5]._M_parent;
  memset(p_Var15,0,0xa8);
  local_358._0_4_ = 0;
  local_378.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)&p_Var15[5]._M_parent;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)p_Var15,&local_358);
  local_358._0_4_ = 1;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
             ((long)local_378.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 0x18),&local_358);
  local_358 = (_Hash_node_base *)CONCAT44(local_358._4_4_,2);
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
             &((_Base_ptr)
              ((long)local_378.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 0x20))->_M_left,&local_358);
  local_358 = (_Hash_node_base *)0x500000003;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
             &((_Base_ptr)
              ((long)local_378.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 0x40))->_M_parent,&local_358);
  local_358 = (_Hash_node_base *)0x500000004;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
             ((long)local_378.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 0x60),&local_358);
  local_358._0_4_ = 5;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
             &((_Base_ptr)
              ((long)local_378.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 0x60))->_M_right,&local_358);
  local_358 = (_Hash_node_base *)CONCAT44(local_358._4_4_,6);
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
             &((_Base_ptr)
              ((long)local_378.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 0x80))->_M_left,&local_358);
  pvVar13 = local_378.
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (local_378.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_378.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar17 = 0;
    p_Var15 = (_Base_ptr)
              local_378.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (local_1e8.mirrorMatrixU_.matrix_._M_h._M_buckets
          [uVar17 % local_1e8.mirrorMatrixU_.matrix_._M_h._M_bucket_count] == (__node_base_ptr)0x0)
      {
LAB_001f1da3:
        std::__throw_out_of_range("_Map_base::at");
      }
      p_Var2 = local_1e8.mirrorMatrixU_.matrix_._M_h._M_buckets
               [uVar17 % local_1e8.mirrorMatrixU_.matrix_._M_h._M_bucket_count]->_M_nxt;
      uVar1 = *(uint *)&p_Var2[1]._M_nxt;
      while ((uint)uVar17 != uVar1) {
        p_Var2 = p_Var2->_M_nxt;
        if ((p_Var2 == (_Hash_node_base *)0x0) ||
           (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
           (ulong)uVar1 % local_1e8.mirrorMatrixU_.matrix_._M_h._M_bucket_count !=
           uVar17 % local_1e8.mirrorMatrixU_.matrix_._M_h._M_bucket_count)) goto LAB_001f1da3;
      }
      get_column_content_via_iterators<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,false,true>>>>
                ((column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_true>_>_>_>
                  *)&local_358,
                 (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_true>_>_>
                  *)(p_Var2 + 2));
      test_column_equality<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,false,true>>>>
                ((witness_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_true>_>_>_>
                  *)p_Var15,
                 (column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_true>_>_>_>
                  *)&local_358);
      uVar17 = (ulong)((uint)uVar17 + 1);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&local_358);
      p_Var15 = (_Base_ptr)&p_Var15->_M_right;
    } while (p_Var15 != (_Base_ptr)pvVar13);
  }
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1f8 = "";
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_200,0x296);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_1e8.mirrorMatrixU_.matrix_._M_h._M_bucket_count;
  uVar17 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar5,0);
  if (local_1e8.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar17 & 0xffffffff] != (__node_base_ptr)0x0)
  {
    p_Var2 = local_1e8.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar17 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    do {
      if (uVar1 == 3) {
        p_Var16 = p_Var2 + 7;
        goto LAB_001f1617;
      }
      p_Var2 = p_Var2->_M_nxt;
    } while ((p_Var2 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
            (ulong)uVar1 % local_1e8.mirrorMatrixU_.matrix_._M_h._M_bucket_count == uVar17));
  }
  std::__throw_out_of_range("_Map_base::at");
  while (*(int *)&p_Var16[2]._M_nxt != 5) {
LAB_001f1617:
    p_Var16 = p_Var16->_M_nxt;
    if (p_Var16 == p_Var2 + 7) break;
  }
  sStack_390.pi_ = (sp_counted_base *)0x0;
  local_388 = "!m.is_zero_entry(3, 5, false)";
  local_380 = (_Base_ptr)0x20b338;
  local_350 = _S_red;
  local_358 = (_Hash_node_base *)&PTR__lazy_ostream_00249168;
  local_348 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_218 = "";
  local_340 = (_Base_ptr)&local_388;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_390);
  local_230 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_228 = "";
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_230,0x297);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_1e8.mirrorMatrixU_.matrix_._M_h._M_bucket_count;
  uVar17 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(4)) % auVar6,0);
  if (local_1e8.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar17 & 0xffffffff] != (__node_base_ptr)0x0)
  {
    p_Var2 = local_1e8.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar17 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    do {
      if (uVar1 == 4) {
        sStack_390.pi_ = (sp_counted_base *)0x0;
        local_388 = "!m.is_zero_column(4, false)";
        local_380 = (_Base_ptr)0x20b354;
        local_350 = _S_red;
        local_358 = (_Hash_node_base *)&PTR__lazy_ostream_00249168;
        local_348 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
        local_250 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_248 = "";
        local_340 = (_Base_ptr)&local_388;
        boost::test_tools::tt_detail::report_assertion();
        boost::detail::shared_count::~shared_count(&sStack_390);
        auVar7._8_8_ = 0;
        auVar7._0_8_ = local_1e8.mirrorMatrixU_.matrix_._M_h._M_bucket_count;
        uVar17 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar7,0);
        if (local_1e8.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar17 & 0xffffffff] ==
            (__node_base_ptr)0x0) goto LAB_001f1daf;
        p_Var2 = local_1e8.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar17 & 0xffffffff]->_M_nxt;
        uVar1 = *(uint *)&p_Var2[1]._M_nxt;
        goto joined_r0x001f17fc;
      }
      p_Var2 = p_Var2->_M_nxt;
    } while ((p_Var2 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
            (ulong)uVar1 % local_1e8.mirrorMatrixU_.matrix_._M_h._M_bucket_count == uVar17));
  }
  std::__throw_out_of_range("_Map_base::at");
  while (*(int *)&p_Var16[2]._M_nxt != 5) {
LAB_001f182e:
    p_Var16 = p_Var16->_M_nxt;
    if (p_Var16 == p_Var2 + 7) goto LAB_001f1861;
  }
  p_Var3 = p_Var16->_M_nxt;
  p_Var4 = p_Var16[1]._M_nxt;
  p_Var4->_M_nxt = p_Var3;
  p_Var3[1]._M_nxt = p_Var4;
  p_Var16->_M_nxt = (_Hash_node_base *)0x0;
  p_Var16[1]._M_nxt = (_Hash_node_base *)0x0;
  local_358 = (_Hash_node_base *)(p_Var2 + 2);
  Gudhi::persistence_matrix::
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_true>_>_>
  ::Delete_disposer::operator()((Delete_disposer *)&local_358,(Entry *)(p_Var16 + -3));
LAB_001f1861:
  local_260 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_258 = "";
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_260,0x299);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_1e8.mirrorMatrixU_.matrix_._M_h._M_bucket_count;
  uVar17 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar8,0);
  if (local_1e8.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar17 & 0xffffffff] != (__node_base_ptr)0x0)
  {
    p_Var2 = local_1e8.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar17 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    do {
      if (uVar1 == 3) {
        p_Var16 = p_Var2 + 7;
        goto LAB_001f18f1;
      }
      p_Var2 = p_Var2->_M_nxt;
    } while ((p_Var2 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
            (ulong)uVar1 % local_1e8.mirrorMatrixU_.matrix_._M_h._M_bucket_count == uVar17));
  }
  std::__throw_out_of_range("_Map_base::at");
  while (*(int *)&p_Var16[2]._M_nxt != 5) {
LAB_001f18f1:
    p_Var16 = p_Var16->_M_nxt;
    if (p_Var16 == p_Var2 + 7) break;
  }
  sStack_390.pi_ = (sp_counted_base *)0x0;
  local_388 = "m.is_zero_entry(3, 5, false)";
  local_380 = (_Base_ptr)0x20b338;
  local_350 = _S_red;
  local_358 = (_Hash_node_base *)&PTR__lazy_ostream_00249168;
  local_348 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_278 = "";
  local_340 = (_Base_ptr)&local_388;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_390);
  local_290 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_288 = "";
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_290,0x29a);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_1e8.mirrorMatrixU_.matrix_._M_h._M_bucket_count;
  uVar17 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(4)) % auVar9,0);
  if (local_1e8.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar17 & 0xffffffff] != (__node_base_ptr)0x0)
  {
    p_Var2 = local_1e8.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar17 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    do {
      if (uVar1 == 4) {
        sStack_390.pi_ = (sp_counted_base *)0x0;
        local_388 = "!m.is_zero_column(4, false)";
        local_380 = (_Base_ptr)0x20b354;
        local_350 = _S_red;
        local_358 = (_Hash_node_base *)&PTR__lazy_ostream_00249168;
        local_348 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
        local_2b0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_2a8 = "";
        local_340 = (_Base_ptr)&local_388;
        boost::test_tools::tt_detail::report_assertion();
        boost::detail::shared_count::~shared_count(&sStack_390);
        auVar10._8_8_ = 0;
        auVar10._0_8_ = local_1e8.mirrorMatrixU_.matrix_._M_h._M_bucket_count;
        uVar17 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(4)) % auVar10,0);
        if (local_1e8.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar17 & 0xffffffff] ==
            (__node_base_ptr)0x0) goto LAB_001f1daf;
        p_Var2 = local_1e8.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar17 & 0xffffffff]->_M_nxt;
        uVar1 = *(uint *)&p_Var2[1]._M_nxt;
        goto joined_r0x001f1ad3;
      }
      p_Var2 = p_Var2->_M_nxt;
    } while ((p_Var2 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
            (ulong)uVar1 % local_1e8.mirrorMatrixU_.matrix_._M_h._M_bucket_count == uVar17));
  }
  std::__throw_out_of_range("_Map_base::at");
  while ((p_Var2 = p_Var2->_M_nxt, p_Var2 != (_Hash_node_base *)0x0 &&
         (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
         (ulong)uVar1 % local_1e8.mirrorMatrixU_.matrix_._M_h._M_bucket_count == uVar17))) {
joined_r0x001f17fc:
    if (uVar1 == 3) {
      p_Var16 = p_Var2 + 7;
      goto LAB_001f182e;
    }
  }
LAB_001f1daf:
  std::__throw_out_of_range("_Map_base::at");
joined_r0x001f1ad3:
  if (uVar1 != 4) {
    p_Var2 = p_Var2->_M_nxt;
    if ((p_Var2 == (_Hash_node_base *)0x0) ||
       (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
       (ulong)uVar1 % local_1e8.mirrorMatrixU_.matrix_._M_h._M_bucket_count != uVar17))
    goto LAB_001f1daf;
    goto joined_r0x001f1ad3;
  }
  boost::intrusive::
  list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,false,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,false,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
  ::
  clear_and_dispose<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,false,true>>>::Delete_disposer>
            ((list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,false,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,false,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
              *)(p_Var2 + 7),
             (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_true>_>_>
              *)(p_Var2 + 2));
  local_2c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2b8 = "";
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2c0,0x29c);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_1e8.mirrorMatrixU_.matrix_._M_h._M_bucket_count;
  uVar17 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar11,0);
  if (local_1e8.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar17 & 0xffffffff] == (__node_base_ptr)0x0)
  goto LAB_001f1deb;
  p_Var2 = local_1e8.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar17 & 0xffffffff]->_M_nxt;
  uVar1 = *(uint *)&p_Var2[1]._M_nxt;
  while (uVar1 != 3) {
    p_Var2 = p_Var2->_M_nxt;
    if ((p_Var2 == (_Hash_node_base *)0x0) ||
       (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
       (ulong)uVar1 % local_1e8.mirrorMatrixU_.matrix_._M_h._M_bucket_count != uVar17)) {
LAB_001f1deb:
      std::__throw_out_of_range("_Map_base::at");
    }
  }
  p_Var16 = p_Var2 + 7;
  do {
    p_Var16 = p_Var16->_M_nxt;
    if (p_Var16 == p_Var2 + 7) break;
  } while (*(int *)&p_Var16[2]._M_nxt != 5);
  sStack_390.pi_ = (sp_counted_base *)0x0;
  local_388 = "m.is_zero_entry(3, 5, false)";
  local_380 = (_Base_ptr)0x20b338;
  local_350 = _S_red;
  local_358 = (_Hash_node_base *)&PTR__lazy_ostream_00249168;
  local_348 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_2e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2d8 = "";
  local_340 = (_Base_ptr)&local_388;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_390);
  local_2f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2e8 = "";
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2f0,0x29d);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_1e8.mirrorMatrixU_.matrix_._M_h._M_bucket_count;
  uVar17 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(4)) % auVar12,0);
  if (local_1e8.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar17 & 0xffffffff] != (__node_base_ptr)0x0)
  {
    p_Var2 = local_1e8.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar17 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    do {
      if (uVar1 == 4) {
        sStack_390.pi_ = (sp_counted_base *)0x0;
        local_388 = "m.is_zero_column(4, false)";
        local_380 = (_Base_ptr)0x20b354;
        local_350 = _S_red;
        local_358 = (_Hash_node_base *)&PTR__lazy_ostream_00249168;
        local_348 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
        local_310 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_308 = "";
        local_340 = (_Base_ptr)&local_388;
        boost::test_tools::tt_detail::report_assertion();
        boost::detail::shared_count::~shared_count(&sStack_390);
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::~vector(&local_378);
        Gudhi::persistence_matrix::
        RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_true>_>_>
        ::reset(&local_1e8,(Column_settings *)local_1f0);
        ppVar14 = local_1f0;
        if (local_1f0 != (pool<boost::default_user_allocator_malloc_free> *)0x0) {
          boost::pool<boost::default_user_allocator_malloc_free>::purge_memory(local_1f0);
        }
        operator_delete(ppVar14,0x38);
        Gudhi::persistence_matrix::
        RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_true>_>_>
        ::~RU_matrix(&local_1e8);
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::~vector(&local_328);
        return;
      }
      p_Var2 = p_Var2->_M_nxt;
    } while ((p_Var2 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
            (ulong)uVar1 % local_1e8.mirrorMatrixU_.matrix_._M_h._M_bucket_count == uVar17));
  }
  std::__throw_out_of_range("_Map_base::at");
}

Assistant:

void test_ru_u_access() {
  auto orderedBoundaries = build_simple_boundary_matrix<typename Matrix::Column>();
  Matrix m(orderedBoundaries, 5);

  std::vector<witness_content<typename Matrix::Column> > uColumns(7);
  if constexpr (Matrix::Option_list::is_z2) {
    uColumns[0] = {0};
    uColumns[1] = {1};
    uColumns[2] = {2};
    uColumns[3] = {3, 5};
    uColumns[4] = {4, 5};
    uColumns[5] = {5};
    uColumns[6] = {6};
  } else {
    uColumns[0] = {{0, 1}};
    uColumns[1] = {{1, 1}};
    uColumns[2] = {{2, 1}};
    uColumns[3] = {{3, 1}};
    uColumns[4] = {{4, 1}};
    uColumns[5] = {{3, 4}, {4, 4}, {5, 1}};
    uColumns[6] = {{6, 1}};
  }

  unsigned int i = 0;
  for (auto& c : uColumns) {
    const auto& col = m.get_column(i++, false);  // to force the const version
    test_column_equality<typename Matrix::Column>(c, get_column_content_via_iterators(col));
  }

  if constexpr (Matrix::Option_list::is_z2) {
    BOOST_CHECK(!m.is_zero_entry(3, 5, false));
    BOOST_CHECK(!m.is_zero_column(4, false));
    m.zero_entry(3, 5, false);
    BOOST_CHECK(m.is_zero_entry(3, 5, false));
    BOOST_CHECK(!m.is_zero_column(4, false));
    m.zero_column(4, false);
    BOOST_CHECK(m.is_zero_entry(3, 5, false));
    BOOST_CHECK(m.is_zero_column(4, false));
  } else {
    BOOST_CHECK(!m.is_zero_entry(5, 3, false));
    BOOST_CHECK(!m.is_zero_column(4, false));
    m.zero_entry(5, 3, false);
    BOOST_CHECK(m.is_zero_entry(5, 3, false));
    BOOST_CHECK(!m.is_zero_column(4, false));
    m.zero_column(4, false);
    BOOST_CHECK(m.is_zero_entry(5, 3, false));
    BOOST_CHECK(m.is_zero_column(4, false));
  }
}